

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Estimate<double> * __thiscall
Catch::Benchmark::Detail::
bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>
          (Estimate<double> *__return_storage_ptr__,Detail *this,double confidence_level,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first,
          __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last,
          sample *resample,
          _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
          **estimator)

{
  int iVar1;
  difference_type dVar2;
  size_type sVar3;
  const_iterator __first;
  const_iterator __last;
  difference_type dVar4;
  int *piVar5;
  const_reference pvVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_00;
  anon_class_8_1_a87844b0_for__M_pred __pred;
  double dVar7;
  double dVar8;
  double dVar9;
  int local_1a0;
  int local_19c;
  int local_198;
  int local_194;
  int hi;
  int local_18c;
  double dStack_188;
  int lo;
  double a2;
  double a1;
  double b2;
  double b1;
  anon_class_16_2_f681591a a;
  anon_class_4_1_54a3980e cumn;
  double z1;
  double bias;
  double prob_n;
  int n;
  double accel;
  double local_f8;
  double local_f0;
  double local_e8;
  pair<double,_double> local_e0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_d0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_c8;
  pair<double,_double> local_c0;
  double local_b0;
  double sum_cubes;
  double sum_squares;
  double *local_90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_88;
  anon_class_8_1_074dbec5 local_80;
  double jack_mean;
  double *local_70;
  undefined1 local_68 [8];
  sample jack;
  double point;
  difference_type n_samples;
  _func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
  **estimator_local;
  sample *resample_local;
  double confidence_level_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> last_local;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> first_local;
  
  last_00._M_current = (double *)resample;
  confidence_level_local = (double)first._M_current;
  last_local._M_current = (double *)this;
  dVar2 = __gnu_cxx::operator-
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                     &confidence_level_local,&last_local);
  jack.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)confidence_level_local;
  __pred.point = (double)(*(code *)(resample->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start)
                                   (last_local._M_current,confidence_level_local);
  if (dVar2 == 1) {
    __return_storage_ptr__->point = __pred.point;
    __return_storage_ptr__->lower_bound = __pred.point;
    __return_storage_ptr__->upper_bound = __pred.point;
    __return_storage_ptr__->confidence_interval = confidence_level;
  }
  else {
    local_70 = last_local._M_current;
    jack_mean = confidence_level_local;
    jackknife<double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>),__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((sample *)local_68,(Detail *)resample,
               (_func_double___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>___normal_iterator<double_ptr,_std::vector<double,_std::allocator<double>_>_>
                **)last_local._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               confidence_level_local,last_00);
    local_88._M_current =
         (double *)clara::std::vector<double,_std::allocator<double>_>::begin((sample *)local_68);
    local_90 = (double *)
               clara::std::vector<double,_std::allocator<double>_>::end((sample *)local_68);
    local_80.jack_mean =
         mean<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                   (local_88,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                              )local_90);
    local_c8._M_current =
         (double *)
         clara::std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)local_68);
    local_d0._M_current =
         (double *)
         clara::std::vector<double,_std::allocator<double>_>::end
                   ((vector<double,_std::allocator<double>_> *)local_68);
    local_e8 = 0.0;
    local_f0 = 0.0;
    local_e0 = std::make_pair<double,double>(&local_e8,&local_f0);
    local_f8 = local_80.jack_mean;
    local_c0 = std::
               accumulate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::pair<double,double>,Catch::Benchmark::Detail::bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>(double,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::vector<double,std::allocator<double>>const&,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>))::_lambda(std::pair<double,double>,double)_1_>
                         (local_c8,local_d0,(pair<double,_double>)local_e0,local_80);
    std::tie<double,double>(&accel,&sum_cubes);
    std::tuple<double&,double&>::operator=((tuple<double&,double&> *)&accel,&local_c0);
    dVar7 = pow(sum_cubes,1.5);
    sVar3 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)last._M_current);
    iVar1 = (int)sVar3;
    __first = std::vector<double,_std::allocator<double>_>::begin(last._M_current);
    __last = std::vector<double,_std::allocator<double>_>::end(last._M_current);
    dVar4 = std::
            count_if<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,Catch::Benchmark::Detail::bootstrap<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>)>(double,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::vector<double,std::allocator<double>>const&,double(*&)(__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>))::_lambda(double)_1_>
                      ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )__first._M_current,
                       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                        )__last._M_current,__pred);
    dVar8 = (double)dVar4 / (double)iVar1;
    if ((dVar8 != 0.0) || (NAN(dVar8))) {
      dVar8 = normal_quantile(dVar8);
      dVar9 = normal_quantile((1.0 - confidence_level) * 0.5);
      b2 = dVar8 + dVar9;
      a1 = dVar8 - dVar9;
      b1 = dVar8;
      a.bias = local_b0 / (dVar7 * 6.0);
      a.accel._4_4_ = iVar1;
      a2 = bootstrap<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_double_(*&)(__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)>
           ::anon_class_16_2_f681591a::operator()((anon_class_16_2_f681591a *)&b1,b2);
      dStack_188 = bootstrap<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_double_(*&)(__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)>
                   ::anon_class_16_2_f681591a::operator()((anon_class_16_2_f681591a *)&b1,a1);
      hi = bootstrap<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_double_(*&)(__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)>
           ::anon_class_4_1_54a3980e::operator()((anon_class_4_1_54a3980e *)((long)&a.accel + 4),a2)
      ;
      local_194 = 0;
      piVar5 = clara::std::max<int>(&hi,&local_194);
      local_18c = *piVar5;
      local_19c = bootstrap<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_double_(*&)(__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)>
                  ::anon_class_4_1_54a3980e::operator()
                            ((anon_class_4_1_54a3980e *)((long)&a.accel + 4),dStack_188);
      local_1a0 = iVar1 + -1;
      piVar5 = clara::std::min<int>(&local_19c,&local_1a0);
      local_198 = *piVar5;
      __return_storage_ptr__->point = __pred.point;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)last._M_current,(long)local_18c
                         );
      __return_storage_ptr__->lower_bound = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)last._M_current,(long)local_198
                         );
      __return_storage_ptr__->upper_bound = *pvVar6;
      __return_storage_ptr__->confidence_interval = confidence_level;
    }
    else {
      __return_storage_ptr__->point = __pred.point;
      __return_storage_ptr__->lower_bound = __pred.point;
      __return_storage_ptr__->upper_bound = __pred.point;
      __return_storage_ptr__->confidence_interval = confidence_level;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

Estimate<double> bootstrap(double confidence_level, Iterator first, Iterator last, sample const& resample, Estimator&& estimator) {
                auto n_samples = last - first;

                double point = estimator(first, last);
                // Degenerate case with a single sample
                if (n_samples == 1) return { point, point, point, confidence_level };

                sample jack = jackknife(estimator, first, last);
                double jack_mean = mean(jack.begin(), jack.end());
                double sum_squares, sum_cubes;
                std::tie(sum_squares, sum_cubes) = std::accumulate(jack.begin(), jack.end(), std::make_pair(0., 0.), [jack_mean](std::pair<double, double> sqcb, double x) -> std::pair<double, double> {
                    auto d = jack_mean - x;
                    auto d2 = d * d;
                    auto d3 = d2 * d;
                    return { sqcb.first + d2, sqcb.second + d3 };
                });

                double accel = sum_cubes / (6 * std::pow(sum_squares, 1.5));
                int n = static_cast<int>(resample.size());
                double prob_n = std::count_if(resample.begin(), resample.end(), [point](double x) { return x < point; }) / (double)n;
                // degenerate case with uniform samples
                if (prob_n == 0) return { point, point, point, confidence_level };

                double bias = normal_quantile(prob_n);
                double z1 = normal_quantile((1. - confidence_level) / 2.);

                auto cumn = [n](double x) -> int {
                    return std::lround(normal_cdf(x) * n); };
                auto a = [bias, accel](double b) { return bias + b / (1. - accel * b); };
                double b1 = bias + z1;
                double b2 = bias - z1;
                double a1 = a(b1);
                double a2 = a(b2);
                auto lo = (std::max)(cumn(a1), 0);
                auto hi = (std::min)(cumn(a2), n - 1);

                return { point, resample[lo], resample[hi], confidence_level };
            }